

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

void __thiscall slang::SVInt::SVInt(SVInt *this,bitwidth_t bits,uint64_t value,bool isSigned)

{
  bool bVar1;
  byte in_CL;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDX;
  bitwidth_t in_ESI;
  SVIntStorage *in_RDI;
  SVInt *unaff_retaddr;
  SVIntStorage *value_00;
  
  value_00 = in_RDI;
  SVIntStorage::SVIntStorage(in_RDI,in_ESI,(bool)(in_CL & 1),false);
  bVar1 = isSingleWord((SVInt *)in_RDI);
  if (bVar1) {
    in_RDI->field_0 = in_RDX;
  }
  else {
    initSlowCase(unaff_retaddr,(uint64_t)value_00);
  }
  clearUnusedBits((SVInt *)value);
  return;
}

Assistant:

SVInt(bitwidth_t bits, uint64_t value, bool isSigned) : SVIntStorage(bits, isSigned, false) {
        SLANG_ASSERT(bits > 0 && bits <= MAX_BITS);
        if (isSingleWord())
            val = value;
        else
            initSlowCase(value);
        clearUnusedBits();
    }